

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint64_t uVar1;
  double dVar2;
  double dVar3;
  uint64_t delta_tm;
  int local_30;
  uint32_t f;
  int i;
  int N;
  uint32_t b;
  uint32_t a;
  uint64_t start_tm;
  char **argv_local;
  int argc_local;
  
  sx_tm_init();
  uVar1 = sx_tm_now();
  puts("Calculating fibonacci sequence ...");
  for (local_30 = 0; local_30 < 100000; local_30 = local_30 + 1) {
  }
  uVar1 = sx_tm_since(uVar1);
  dVar2 = sx_tm_us(uVar1);
  dVar3 = sx_tm_sec(uVar1);
  printf("Took %lf us (%lf secs)\n",dVar2,SUB84(dVar3,0));
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    sx_tm_init();

    uint64_t start_tm = sx_tm_now();
    puts("Calculating fibonacci sequence ...");
    uint32_t a = 0;
    uint32_t b = 1;
    int N = 100000;
    for (int i = 0; i < N; i++) {
        uint32_t f = a + b;
        a = b;
        b = f;
    }
    uint64_t delta_tm = sx_tm_since(start_tm);
    printf("Took %lf us (%lf secs)\n", sx_tm_us(delta_tm), sx_tm_sec(delta_tm));

    return 0;
}